

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

uint __thiscall
Saturation::PredicateSplitPassiveClauseContainer::bestQueue
          (PredicateSplitPassiveClauseContainer *this,float featureValue)

{
  pointer pfVar1;
  uint uVar2;
  
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if (((ulong)((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pfVar1 >> 2) <= (ulong)uVar2) ||
       (featureValue <= pfVar1[uVar2])) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

unsigned PredicateSplitPassiveClauseContainer::bestQueue(float featureValue) const
{
  // compute best queue clause should be placed in
  ASS(_cutoffs.back() == std::numeric_limits<float>::max());
  for (unsigned i = 0; i < _cutoffs.size(); i++)
  {
    if (featureValue <= _cutoffs[i])
    {
      return i;
    }
  }
  // unreachable
  ASSERTION_VIOLATION;
}